

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcompleter.cpp
# Opt level: O1

bool __thiscall
QCompletionEngine::lookupCache
          (QCompletionEngine *this,QString *part,QModelIndex *parent,QMatchData *m)

{
  QMapData<std::map<QModelIndex,_QMap<QString,_QMatchData>,_std::less<QModelIndex>,_std::allocator<std::pair<const_QModelIndex,_QMap<QString,_QMatchData>_>_>_>_>
  *pQVar1;
  const_iterator cVar2;
  const_iterator cVar3;
  _Base_ptr p_Var4;
  long in_FS_OFFSET;
  bool bVar5;
  key_type local_48;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  if ((part->d).size != 0) {
    pQVar1 = (this->cache).d.d.ptr;
    if (pQVar1 == (QMapData<std::map<QModelIndex,_QMap<QString,_QMatchData>,_std::less<QModelIndex>,_std::allocator<std::pair<const_QModelIndex,_QMap<QString,_QMatchData>_>_>_>_>
                   *)0x0) {
      cVar2._M_node = (_Base_ptr)0x0;
    }
    else {
      cVar2 = std::
              _Rb_tree<QModelIndex,_std::pair<const_QModelIndex,_QMap<QString,_QMatchData>_>,_std::_Select1st<std::pair<const_QModelIndex,_QMap<QString,_QMatchData>_>_>,_std::less<QModelIndex>,_std::allocator<std::pair<const_QModelIndex,_QMap<QString,_QMatchData>_>_>_>
              ::find(&(pQVar1->m)._M_t,parent);
    }
    pQVar1 = (this->cache).d.d.ptr;
    p_Var4 = &(pQVar1->m)._M_t._M_impl.super__Rb_tree_header._M_header;
    if (pQVar1 == (QMapData<std::map<QModelIndex,_QMap<QString,_QMatchData>,_std::less<QModelIndex>,_std::allocator<std::pair<const_QModelIndex,_QMap<QString,_QMatchData>_>_>_>_>
                   *)0x0) {
      p_Var4 = (_Base_ptr)0x0;
    }
    if (cVar2._M_node != p_Var4) {
      local_48.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
      local_48.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
      local_48.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
      if (this->c->cs == CaseInsensitive) {
        QString::toLower_helper((QString *)&local_48);
      }
      else {
        local_48.d.d = (part->d).d;
        local_48.d.ptr = (part->d).ptr;
        local_48.d.size = (part->d).size;
        if (&(local_48.d.d)->super_QArrayData != (QArrayData *)0x0) {
          LOCK();
          (((QArrayData *)&((local_48.d.d)->super_QArrayData).ref_)->ref_)._q_value.
          super___atomic_base<int>._M_i =
               (((QArrayData *)&((local_48.d.d)->super_QArrayData).ref_)->ref_)._q_value.
               super___atomic_base<int>._M_i + 1;
          UNLOCK();
        }
      }
      if (cVar2._M_node[1]._M_right == (_Base_ptr)0x0) {
        cVar3._M_node = (_Base_ptr)0x0;
      }
      else {
        cVar3 = std::
                _Rb_tree<QString,_std::pair<const_QString,_QMatchData>,_std::_Select1st<std::pair<const_QString,_QMatchData>_>,_std::less<QString>,_std::allocator<std::pair<const_QString,_QMatchData>_>_>
                ::find((_Rb_tree<QString,_std::pair<const_QString,_QMatchData>,_std::_Select1st<std::pair<const_QString,_QMatchData>_>,_std::less<QString>,_std::allocator<std::pair<const_QString,_QMatchData>_>_>
                        *)&(cVar2._M_node[1]._M_right)->_M_parent,&local_48);
      }
      p_Var4 = (_Base_ptr)&(cVar2._M_node[1]._M_right)->_M_left;
      if (cVar2._M_node[1]._M_right == (_Base_ptr)0x0) {
        p_Var4 = (_Base_ptr)0x0;
      }
      bVar5 = cVar3._M_node != p_Var4;
      if (bVar5) {
        (m->indices).v = *(bool *)&cVar3._M_node[1]._M_right;
        QArrayDataPointer<int>::operator=
                  (&(m->indices).vector.d,(QArrayDataPointer<int> *)(cVar3._M_node + 2));
        *(_Base_ptr *)&(m->indices).f = cVar3._M_node[2]._M_right;
        m->partial = (bool)cVar3._M_node[3].field_0x4;
        m->exactMatchIndex = cVar3._M_node[3]._M_color;
      }
      if (&(local_48.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_48.d.d)->super_QArrayData,2,0x10);
        }
      }
      goto LAB_00657d53;
    }
  }
  bVar5 = false;
LAB_00657d53:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return bVar5;
  }
  __stack_chk_fail();
}

Assistant:

bool QCompletionEngine::lookupCache(const QString &part, const QModelIndex &parent, QMatchData *m) const
{
    if (part.isEmpty())
        return false; // early out to avoid cache[parent] lookup costs

    const auto cit = cache.find(parent);
    if (cit == cache.end())
        return false;

    const CacheItem& map = *cit;

    const QString key = c->cs == Qt::CaseInsensitive ? part.toLower() : part;

    const auto it = map.find(key);
    if (it == map.end())
        return false;

    *m = it.value();
    return true;
}